

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::TraceInstruction
          (UpgradeMemoryModel *this,Instruction *inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited)

{
  pair<bool,_bool> pVar1;
  byte bVar2;
  byte bVar3;
  pair<bool,_bool> pVar4;
  pair<bool,_bool> pVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Op OVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  __ireturn_type _Var11;
  bool is_volatile;
  bool is_coherent;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  undefined1 local_60 [16];
  _Manager_type local_50;
  code *local_48;
  _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_40;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *visited_local;
  
  local_40 = (_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)visited;
  visited_local = visited;
  local_60._0_4_ = Instruction::result_id(inst);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_60 + 8),indices);
  iVar9 = std::
          _Hashtable<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->cache_)._M_h,(key_type *)local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_60 + 8));
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(pair<bool,_bool> *)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_true>
                   ._M_cur + 0x28);
  }
  local_68 = indices;
  local_60._0_4_ = Instruction::result_id(inst);
  _Var11 = std::__detail::
           _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
           ::insert(local_40,(value_type *)local_60);
  if (((undefined1  [16])_Var11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pVar4.first = false;
    pVar4.second = false;
    return pVar4;
  }
  local_60._0_4_ = Instruction::result_id(inst);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_60 + 8),local_68);
  pmVar10 = std::__detail::
            _Map_base<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::pair<bool,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_spvtools::opt::CacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->cache_,(key_type *)local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(local_60 + 8));
  this_00 = local_68;
  pmVar10->first = false;
  pmVar10->second = false;
  bVar2 = 0;
  is_coherent = false;
  is_volatile = false;
  OVar8 = inst->opcode_;
  if (OVar8 - OpAccessChain < 2) {
    uVar6 = Instruction::NumInOperands(inst);
    this_00 = local_68;
    while (uVar6 = uVar6 - 1, uVar6 != 0) {
      uVar7 = Instruction::GetSingleWordInOperand(inst,uVar6);
      local_60._0_4_ = uVar7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_00,(uint *)local_60);
    }
LAB_0019fea6:
    bVar2 = 0;
    bVar3 = 0;
  }
  else {
    if (OVar8 != OpFunctionParameter) {
      if (OVar8 == OpPtrAccessChain) {
        uVar6 = Instruction::NumInOperands(inst);
        while (uVar6 = uVar6 - 1, 1 < uVar6) {
          uVar7 = Instruction::GetSingleWordInOperand(inst,uVar6);
          local_60._0_4_ = uVar7;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)local_60);
        }
        goto LAB_0019fea6;
      }
      bVar3 = 0;
      if (OVar8 != OpVariable) goto LAB_0019feae;
    }
    bVar2 = HasDecoration(this,inst,0,Coherent);
    is_coherent = (bool)bVar2;
    bVar3 = HasDecoration(this,inst,0,Volatile);
    if (!(bool)bVar3 || !(bool)bVar2) {
      is_volatile = (bool)bVar3;
      uVar6 = Instruction::type_id(inst);
      pVar4 = CheckType(this,uVar6,this_00);
      bVar2 = bVar2 | pVar4.first;
      bVar3 = bVar3 | pVar4.second;
      is_coherent = (bool)bVar2;
    }
    is_volatile = (bool)bVar3;
    if (((bVar2 & 1) != 0) && ((bVar3 & 1) != 0)) {
      pmVar10->first = true;
      pmVar10->second = true;
      pVar5.first = true;
      pVar5.second = true;
      return pVar5;
    }
  }
  OVar8 = inst->opcode_;
LAB_0019feae:
  if ((OVar8 != OpFunctionParameter) && (OVar8 != OpVariable)) {
    local_60._8_8_ = (pointer)0x0;
    local_60._0_8_ = operator_new(0x28);
    *(UpgradeMemoryModel **)local_60._0_8_ = this;
    *(bool **)(local_60._0_8_ + 8) = &is_coherent;
    *(bool **)(local_60._0_8_ + 0x10) = &is_volatile;
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(local_60._0_8_ + 0x18) = this_00;
    *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ***)(local_60._0_8_ + 0x20) = &visited_local;
    local_48 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:384:23)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:384:23)>
               ::_M_manager;
    Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)local_60);
    bVar2 = is_coherent;
    bVar3 = is_volatile;
    if (local_50 != (_Manager_type)0x0) {
      (*local_50)((_Any_data *)local_60,(_Any_data *)local_60,__destroy_functor);
      bVar2 = is_coherent;
      bVar3 = is_volatile;
    }
  }
  pmVar10->first = (bool)bVar2;
  pmVar10->second = (bool)bVar3;
  pVar1.second = (bool)bVar3;
  pVar1.first = (bool)bVar2;
  return pVar1;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::TraceInstruction(
    Instruction* inst, std::vector<uint32_t> indices,
    std::unordered_set<uint32_t>* visited) {
  auto iter = cache_.find(std::make_pair(inst->result_id(), indices));
  if (iter != cache_.end()) {
    return iter->second;
  }

  if (!visited->insert(inst->result_id()).second) {
    return std::make_pair(false, false);
  }

  // Initialize the cache before |indices| is (potentially) modified.
  auto& cached_result = cache_[std::make_pair(inst->result_id(), indices)];
  cached_result.first = false;
  cached_result.second = false;

  bool is_coherent = false;
  bool is_volatile = false;
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpFunctionParameter:
      is_coherent |= HasDecoration(inst, 0, spv::Decoration::Coherent);
      is_volatile |= HasDecoration(inst, 0, spv::Decoration::Volatile);
      if (!is_coherent || !is_volatile) {
        bool type_coherent = false;
        bool type_volatile = false;
        std::tie(type_coherent, type_volatile) =
            CheckType(inst->type_id(), indices);
        is_coherent |= type_coherent;
        is_volatile |= type_volatile;
      }
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
      // Store indices in reverse order.
      for (uint32_t i = inst->NumInOperands() - 1; i > 0; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    case spv::Op::OpPtrAccessChain:
      // Store indices in reverse order. Skip the |Element| operand.
      for (uint32_t i = inst->NumInOperands() - 1; i > 1; --i) {
        indices.push_back(inst->GetSingleWordInOperand(i));
      }
      break;
    default:
      break;
  }

  // No point searching further.
  if (is_coherent && is_volatile) {
    cached_result.first = true;
    cached_result.second = true;
    return std::make_pair(true, true);
  }

  // Variables and function parameters are sources. Continue searching until we
  // reach them.
  if (inst->opcode() != spv::Op::OpVariable &&
      inst->opcode() != spv::Op::OpFunctionParameter) {
    inst->ForEachInId([this, &is_coherent, &is_volatile, &indices,
                       &visited](const uint32_t* id_ptr) {
      Instruction* op_inst = context()->get_def_use_mgr()->GetDef(*id_ptr);
      const analysis::Type* type =
          context()->get_type_mgr()->GetType(op_inst->type_id());
      if (type &&
          (type->AsPointer() || type->AsImage() || type->AsSampledImage())) {
        bool operand_coherent = false;
        bool operand_volatile = false;
        std::tie(operand_coherent, operand_volatile) =
            TraceInstruction(op_inst, indices, visited);
        is_coherent |= operand_coherent;
        is_volatile |= operand_volatile;
      }
    });
  }

  cached_result.first = is_coherent;
  cached_result.second = is_volatile;
  return std::make_pair(is_coherent, is_volatile);
}